

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_functions.cpp
# Opt level: O1

ir_function_signature * __thiscall
anon_unknown.dwarf_e4c90::builtin_builder::_invocation_interlock
          (builtin_builder *this,char *intrinsic_name,builtin_available_predicate avail)

{
  ir_function_signature *piVar1;
  ir_function *this_00;
  ir_call *ir;
  ir_variable *ret;
  ir_factory body;
  ir_factory local_28;
  
  piVar1 = new_sig(&builtins,&glsl_type::_void_type,(builtin_available_predicate)intrinsic_name,0);
  local_28.instructions = &piVar1->body;
  local_28.mem_ctx = builtins.mem_ctx;
  piVar1->field_0x48 = piVar1->field_0x48 | 1;
  this_00 = glsl_symbol_table::get_function((builtins.shader)->symbols,(char *)this);
  ir = call((builtin_builder *)this_00,(ir_function *)0x0,ret,piVar1->parameters);
  ir_builder::ir_factory::emit(&local_28,&ir->super_ir_instruction);
  return piVar1;
}

Assistant:

ir_function_signature *
builtin_builder::_invocation_interlock(const char *intrinsic_name,
                                       builtin_available_predicate avail)
{
   MAKE_SIG(glsl_type::void_type, avail, 0);
   body.emit(call(shader->symbols->get_function(intrinsic_name),
                  NULL, sig->parameters));
   return sig;
}